

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcConditionCriterion,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcConditionCriterion *in;
  
  in = (IfcConditionCriterion *)operator_new(0x128);
  *(undefined ***)&in->field_0x110 = &PTR__Object_007e6a70;
  *(undefined8 *)&in->field_0x118 = 0;
  *(char **)&in->field_0x120 = "IfcConditionCriterion";
  Assimp::IFC::Schema_2x3::IfcControl::IfcControl
            ((IfcControl *)in,&PTR_construction_vtable_24__0089d820);
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConditionCriterion,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined ***)in = &PTR__IfcConditionCriterion_0089d740;
  *(undefined ***)&in->field_0x110 = &PTR__IfcConditionCriterion_0089d808;
  *(undefined ***)&in->field_0x88 = &PTR__IfcConditionCriterion_0089d768;
  *(undefined ***)&in->field_0x98 = &PTR__IfcConditionCriterion_0089d790;
  *(undefined ***)&in->field_0xd0 = &PTR__IfcConditionCriterion_0089d7b8;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConditionCriterion,_2UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcConditionCriterion_0089d7e0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConditionCriterion,_2UL>).field_0x10 = 0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConditionCriterion,_2UL>).field_0x18 = 0;
  *(undefined8 *)
   &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConditionCriterion,_2UL>).field_0x20 = 0;
  *(undefined8 *)&in->field_0x108 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcConditionCriterion>(db,params,in);
  return (Object *)(&in->field_0x0 + *(long *)(*(long *)in + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }